

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::setOrder(ConfigData *config,string *order)

{
  bool bVar1;
  InWhatOrder IVar2;
  runtime_error *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&sStack_58,"declared",(allocator *)&local_38);
  bVar1 = startsWith(&sStack_58,order);
  std::__cxx11::string::~string((string *)&sStack_58);
  IVar2 = InDeclarationOrder;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&sStack_58,"lexical",(allocator *)&local_38);
    bVar1 = startsWith(&sStack_58,order);
    std::__cxx11::string::~string((string *)&sStack_58);
    if (bVar1) {
      IVar2 = InLexicographicalOrder;
    }
    else {
      std::__cxx11::string::string((string *)&sStack_58,"random",(allocator *)&local_38);
      bVar1 = startsWith(&sStack_58,order);
      std::__cxx11::string::~string((string *)&sStack_58);
      if (!bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_38,"Unrecognised ordering: \'",order);
        std::operator+(&sStack_58,&local_38,"\'");
        std::runtime_error::runtime_error(this,(string *)&sStack_58);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      IVar2 = InRandomOrder;
    }
  }
  config->runOrder = IVar2;
  return;
}

Assistant:

inline void setOrder( ConfigData& config, std::string const& order ) {
        if( startsWith( "declared", order ) )
            config.runOrder = RunTests::InDeclarationOrder;
        else if( startsWith( "lexical", order ) )
            config.runOrder = RunTests::InLexicographicalOrder;
        else if( startsWith( "random", order ) )
            config.runOrder = RunTests::InRandomOrder;
        else
            throw std::runtime_error( "Unrecognised ordering: '" + order + "'" );
    }